

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::extract_global_variables_from_function
          (CompilerMSL *this,uint32_t func_id,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *added_arg_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *global_var_ids,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *processed_func_ids)

{
  _Rb_tree_const_iterator<unsigned_int> __last;
  BuiltIn BVar1;
  uint uVar2;
  _Hash_node_base *p_Var3;
  size_t sVar4;
  _Hash_node_base *p_Var5;
  Parameter *pPVar6;
  Decoration *pDVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  undefined3 uVar25;
  undefined4 uVar26;
  SPIRFunction *pSVar27;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var28;
  bool bVar29;
  uint32_t uVar30;
  ExecutionModel EVar31;
  ID id;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var32;
  SPIRBlock *pSVar33;
  uint32_t *puVar34;
  size_type sVar35;
  __node_base_ptr p_Var36;
  SPIRVariable *pSVar37;
  SPIRType *pSVar38;
  mapped_type *pmVar39;
  mapped_type *pmVar40;
  TypedID<(spirv_cross::Types)6> *pTVar41;
  ulong uVar42;
  ulong uVar43;
  Instruction *instr;
  ulong uVar44;
  ParsedIR *__v;
  CompilerMSL *this_00;
  __node_base_ptr p_Var45;
  __node_base_ptr p_Var46;
  long lVar47;
  _Base_ptr p_Var48;
  Instruction *pIVar49;
  uint32_t rvalue_id;
  uint32_t type_id;
  uint32_t ptr_type_id;
  __node_gen_type __node_gen;
  __hashtable *__h;
  undefined1 local_124 [12];
  key_type local_118;
  StorageClass local_114;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Base_ptr local_f0;
  size_t local_e8;
  _Base_ptr local_e0;
  SPIRFunction *local_d8;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *local_d0;
  ParsedIR *local_c8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_c0;
  SPIRType *local_b8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_b0;
  CompilerMSL *local_a8;
  TypedID<(spirv_cross::Types)6> *local_a0;
  SPIRVariable *local_98;
  key_type local_8c;
  ulong local_88;
  ulong local_80;
  _Base_ptr local_78;
  string local_70;
  string local_50;
  
  uVar44 = (processed_func_ids->_M_h)._M_bucket_count;
  uVar42 = (ulong)func_id % uVar44;
  p_Var45 = (processed_func_ids->_M_h)._M_buckets[uVar42];
  p_Var36 = (__node_base_ptr)0x0;
  if ((p_Var45 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var45->_M_nxt, p_Var36 = p_Var45,
     *(uint32_t *)&p_Var45->_M_nxt[1]._M_nxt != func_id)) {
    while (p_Var45 = p_Var3, p_Var3 = p_Var45->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var36 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar44 != uVar42) ||
         (p_Var36 = p_Var45, *(uint *)&p_Var3[1]._M_nxt == func_id)) goto LAB_00257d7a;
    }
    p_Var36 = (__node_base_ptr)0x0;
  }
LAB_00257d7a:
  local_114 = func_id;
  local_c0 = processed_func_ids;
  if ((p_Var36 == (__node_base_ptr)0x0) || (p_Var36->_M_nxt == (_Hash_node_base *)0x0)) {
    local_110._0_8_ = processed_func_ids;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)processed_func_ids,&local_114);
    local_d8 = Variant::get<spirv_cross::SPIRFunction>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + local_114);
    sVar4 = (local_d8->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
            buffer_size;
    local_a8 = this;
    if (sVar4 != 0) {
      pTVar41 = (local_d8->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
                ptr;
      local_a0 = pTVar41 + sVar4;
      local_b0 = &(this->atomic_image_vars)._M_h;
      local_b8 = (SPIRType *)&this->builtin_frag_coord_id;
      local_98 = (SPIRVariable *)&this->builtin_layer_id;
      local_c8 = (ParsedIR *)&this->builtin_view_idx_id;
      do {
        local_d0 = (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)pTVar41;
        pSVar33 = Variant::get<spirv_cross::SPIRBlock>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + pTVar41->id);
        sVar4 = (pSVar33->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
        if (sVar4 != 0) {
          instr = (pSVar33->ops).super_VectorView<spirv_cross::Instruction>.ptr;
          pIVar49 = instr + sVar4;
LAB_00257e77:
          puVar34 = Compiler::stream((Compiler *)this,instr);
          switch(instr->op) {
          case 0x39:
            if (3 < instr->length) {
              uVar44 = 3;
              do {
                uVar2 = puVar34[uVar44];
                local_110._0_4_ = uVar2;
                uVar42 = (global_var_ids->_M_h)._M_bucket_count;
                uVar43 = (ulong)uVar2 % uVar42;
                p_Var45 = (global_var_ids->_M_h)._M_buckets[uVar43];
                p_Var36 = (__node_base_ptr)0x0;
                if ((p_Var45 != (__node_base_ptr)0x0) &&
                   (p_Var36 = p_Var45, p_Var46 = p_Var45->_M_nxt,
                   uVar2 != *(uint *)&p_Var45->_M_nxt[1]._M_nxt)) {
                  while (p_Var3 = p_Var46->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
                    p_Var36 = (__node_base_ptr)0x0;
                    if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar42 != uVar43) ||
                       (p_Var36 = p_Var46, p_Var46 = p_Var3, uVar2 == *(uint *)&p_Var3[1]._M_nxt))
                    goto LAB_0025811f;
                  }
                  p_Var36 = (__node_base_ptr)0x0;
                }
LAB_0025811f:
                if ((p_Var36 != (__node_base_ptr)0x0) && (p_Var36->_M_nxt != (_Hash_node_base *)0x0)
                   ) {
                  ::std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::_M_insert_unique<unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)added_arg_ids,(uint *)local_110);
                }
                uVar44 = uVar44 + 1;
              } while (uVar44 < instr->length);
            }
            this = local_a8;
            local_110._8_8_ = local_110._8_8_ & 0xffffffff00000000;
            local_100._M_allocated_capacity = 0;
            __last._M_node = (_Base_ptr)(local_110 + 8);
            local_e8 = 0;
            local_100._8_8_ = __last._M_node;
            local_f0 = __last._M_node;
            extract_global_variables_from_function
                      (local_a8,puVar34[2],
                       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_110,global_var_ids,local_c0);
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<unsigned_int>>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)added_arg_ids,(_Rb_tree_const_iterator<unsigned_int>)local_100._8_8_,
                       __last);
            ::std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_110);
            break;
          case 0x3a:
          case 0x3b:
          case 0x3f:
          case 0x40:
            break;
          case 0x3c:
            local_110._0_4_ = puVar34[2];
            pSVar37 = Compiler::maybe_get_backing_variable((Compiler *)this,puVar34[2]);
            if (pSVar37 != (SPIRVariable *)0x0) {
              local_124._0_4_ = (pSVar37->super_IVariant).self.id;
              sVar35 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count(local_b0,(key_type *)local_124);
              if (sVar35 != 0) {
                uVar44 = (global_var_ids->_M_h)._M_bucket_count;
                uVar42 = (local_110._0_8_ & 0xffffffff) % uVar44;
                p_Var45 = (global_var_ids->_M_h)._M_buckets[uVar42];
                p_Var36 = (__node_base_ptr)0x0;
                if (p_Var45 != (__node_base_ptr)0x0) {
                  BVar1 = *(BuiltIn *)&p_Var45->_M_nxt[1]._M_nxt;
                  p_Var46 = p_Var45->_M_nxt;
                  do {
                    p_Var36 = p_Var45;
                    if (local_110._0_4_ == BVar1) break;
                    p_Var3 = p_Var46->_M_nxt;
                    if (p_Var3 == (_Hash_node_base *)0x0) goto LAB_00258370;
                    BVar1 = *(BuiltIn *)&p_Var3[1]._M_nxt;
                    p_Var36 = (__node_base_ptr)0x0;
                    p_Var45 = p_Var46;
                    p_Var46 = p_Var3;
                  } while ((ulong)BVar1 % uVar44 == uVar42);
                }
                goto LAB_00258372;
              }
            }
            break;
          case 0x3d:
          case 0x41:
          case 0x42:
          case 0x43:
          case 0x44:
            local_110._0_4_ = puVar34[2];
            uVar44 = (global_var_ids->_M_h)._M_bucket_count;
            uVar42 = (ulong)(uint)local_110._0_4_ % uVar44;
            p_Var45 = (global_var_ids->_M_h)._M_buckets[uVar42];
            p_Var36 = (__node_base_ptr)0x0;
            if ((p_Var45 != (__node_base_ptr)0x0) &&
               (p_Var36 = p_Var45, p_Var46 = p_Var45->_M_nxt,
               local_110._0_4_ != *(uint *)&p_Var45->_M_nxt[1]._M_nxt)) {
              while (p_Var3 = p_Var46->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
                p_Var36 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar44 != uVar42) ||
                   (p_Var36 = p_Var46, p_Var46 = p_Var3,
                   local_110._0_4_ == *(uint *)&p_Var3[1]._M_nxt)) goto LAB_002581ac;
              }
              p_Var36 = (__node_base_ptr)0x0;
            }
LAB_002581ac:
            if ((p_Var36 != (__node_base_ptr)0x0) && (p_Var36->_M_nxt != (_Hash_node_base *)0x0)) {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,(uint *)local_110);
            }
            pSVar38 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + *puVar34);
            if (((*(int *)&(pSVar38->super_IVariant).field_0xc != 0x10) ||
                ((pSVar38->image).dim != DimSubpassData)) ||
               (((this->msl_options).platform == iOS &&
                ((this->msl_options).ios_use_framebuffer_fetch_subpasses != false)))) break;
            if (*(uint32_t *)&(local_b8->super_IVariant)._vptr_IVariant == 0) {
              __assert_fail("builtin_frag_coord_id != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x562,
                            "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                           );
            }
            ::std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)added_arg_ids,(uint *)local_b8);
            if ((this->msl_options).multiview == true) {
              __v = local_c8;
              if (*(int *)&((IVariant *)&local_c8->pool_group)->_vptr_IVariant == 0) {
                __assert_fail("builtin_view_idx_id != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                              ,0x567,
                              "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                             );
              }
            }
            else {
              if ((this->msl_options).arrayed_subpass_input != true) break;
              __v = (ParsedIR *)local_98;
              if (*(int *)&(local_98->super_IVariant)._vptr_IVariant == 0) {
                __assert_fail("builtin_layer_id != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                              ,0x56d,
                              "void spirv_cross::CompilerMSL::extract_global_variables_from_function(uint32_t, std::set<uint32_t> &, unordered_set<uint32_t> &, unordered_set<uint32_t> &)"
                             );
              }
            }
            goto LAB_00258385;
          case 0x3e:
            local_110._0_4_ = *puVar34;
            uVar44 = (global_var_ids->_M_h)._M_bucket_count;
            uVar42 = (ulong)(uint)local_110._0_4_ % uVar44;
            p_Var45 = (global_var_ids->_M_h)._M_buckets[uVar42];
            p_Var36 = (__node_base_ptr)0x0;
            if ((p_Var45 != (__node_base_ptr)0x0) &&
               (p_Var36 = p_Var45, p_Var46 = p_Var45->_M_nxt,
               local_110._0_4_ != *(uint *)&p_Var45->_M_nxt[1]._M_nxt)) {
              while (p_Var3 = p_Var46->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
                p_Var36 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar44 != uVar42) ||
                   (p_Var36 = p_Var46, p_Var46 = p_Var3,
                   local_110._0_4_ == *(uint *)&p_Var3[1]._M_nxt)) goto LAB_0025825c;
              }
              p_Var36 = (__node_base_ptr)0x0;
            }
LAB_0025825c:
            if ((p_Var36 != (__node_base_ptr)0x0) && (p_Var36->_M_nxt != (_Hash_node_base *)0x0)) {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,(uint *)local_110);
            }
            local_124._0_4_ = puVar34[1];
            uVar44 = (global_var_ids->_M_h)._M_bucket_count;
            uVar42 = (ulong)(uint)local_124._0_4_ % uVar44;
            p_Var45 = (global_var_ids->_M_h)._M_buckets[uVar42];
            p_Var36 = (__node_base_ptr)0x0;
            if ((p_Var45 != (__node_base_ptr)0x0) &&
               (p_Var36 = p_Var45, p_Var46 = p_Var45->_M_nxt,
               local_124._0_4_ != *(uint *)&p_Var45->_M_nxt[1]._M_nxt)) {
              while (p_Var3 = p_Var46->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
                p_Var36 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar44 != uVar42) ||
                   (p_Var36 = p_Var46, p_Var46 = p_Var3,
                   local_124._0_4_ == *(uint *)&p_Var3[1]._M_nxt)) goto LAB_002582d6;
              }
              p_Var36 = (__node_base_ptr)0x0;
            }
LAB_002582d6:
            if ((p_Var36 != (__node_base_ptr)0x0) && (p_Var36->_M_nxt != (_Hash_node_base *)0x0)) {
              __v = (ParsedIR *)local_124;
              goto LAB_00258385;
            }
            break;
          default:
            if (instr->op != 0xa9) break;
            local_110._0_4_ = puVar34[3];
            uVar44 = (global_var_ids->_M_h)._M_bucket_count;
            uVar42 = (ulong)(uint)local_110._0_4_ % uVar44;
            p_Var45 = (global_var_ids->_M_h)._M_buckets[uVar42];
            p_Var36 = (__node_base_ptr)0x0;
            if ((p_Var45 != (__node_base_ptr)0x0) &&
               (p_Var36 = p_Var45, p_Var46 = p_Var45->_M_nxt,
               local_110._0_4_ != *(BuiltIn *)&p_Var45->_M_nxt[1]._M_nxt)) {
              while (p_Var3 = p_Var46->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
                p_Var36 = (__node_base_ptr)0x0;
                if (((ulong)*(BuiltIn *)&p_Var3[1]._M_nxt % uVar44 != uVar42) ||
                   (p_Var36 = p_Var46, p_Var46 = p_Var3,
                   local_110._0_4_ == *(BuiltIn *)&p_Var3[1]._M_nxt)) goto LAB_002582f8;
              }
              p_Var36 = (__node_base_ptr)0x0;
            }
LAB_002582f8:
            if ((p_Var36 != (__node_base_ptr)0x0) && (p_Var36->_M_nxt != (_Hash_node_base *)0x0)) {
              ::std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)added_arg_ids,(uint *)local_110);
            }
            local_110._0_4_ = puVar34[4];
            uVar44 = (global_var_ids->_M_h)._M_bucket_count;
            uVar42 = (ulong)(uint)local_110._0_4_ % uVar44;
            p_Var45 = (global_var_ids->_M_h)._M_buckets[uVar42];
            p_Var36 = (__node_base_ptr)0x0;
            if (p_Var45 != (__node_base_ptr)0x0) {
              uVar2 = *(uint *)&p_Var45->_M_nxt[1]._M_nxt;
              p_Var3 = p_Var45->_M_nxt;
              do {
                p_Var36 = p_Var45;
                if (local_110._0_4_ == uVar2) break;
                p_Var5 = p_Var3->_M_nxt;
                if (p_Var5 == (_Hash_node_base *)0x0) goto LAB_00258370;
                uVar2 = *(uint *)&p_Var5[1]._M_nxt;
                p_Var36 = (__node_base_ptr)0x0;
                p_Var45 = p_Var3;
                p_Var3 = p_Var5;
              } while ((ulong)uVar2 % uVar44 == uVar42);
            }
            goto LAB_00258372;
          }
          goto switchD_00257ea3_caseD_3a;
        }
LAB_00258397:
        pTVar41 = (TypedID<(spirv_cross::Types)6> *)((long)local_d0 + 4);
      } while (pTVar41 != local_a0);
    }
    p_Var32 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,&local_114)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(p_Var32,&added_arg_ids->_M_t);
    if (local_114 != (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
      local_78 = (added_arg_ids->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_e0 = &(added_arg_ids->_M_t)._M_impl.super__Rb_tree_header._M_header;
      if (local_78 != local_e0) {
        local_c8 = &(this->super_CompilerGLSL).super_Compiler.ir;
        local_d0 = &local_d8->arguments;
        local_b0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
        local_80 = 0;
        local_88 = 0;
        do {
          local_124._0_4_ = local_78[1]._M_color;
          pSVar37 = Variant::get<spirv_cross::SPIRVariable>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + (uint)local_124._0_4_);
          local_124._4_4_ = *(undefined4 *)&(pSVar37->super_IVariant).field_0xc;
          pSVar38 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + (uint)local_124._4_4_);
          uVar30 = Compiler::get_decoration((Compiler *)this,(ID)local_124._0_4_,DecorationBuiltIn);
          bVar29 = Compiler::is_tessellation_shader((Compiler *)this);
          if (((((!bVar29) || (pSVar37->storage != StorageClassInput)) &&
               ((EVar31 = Compiler::get_execution_model((Compiler *)this),
                EVar31 != ExecutionModelTessellationControl ||
                (pSVar37->storage != StorageClassOutput)))) ||
              ((bVar29 = Compiler::has_decoration
                                   ((Compiler *)this,(ID)local_124._0_4_,DecorationPatch), bVar29 ||
               (bVar29 = is_patch_block(this,pSVar38), bVar29)))) ||
             ((bVar29 = Compiler::is_builtin_variable((Compiler *)this,pSVar37), p_Var48 = local_e0,
              bVar29 && (((4 < uVar30 || (uVar30 == 2)) &&
                         (*(int *)&(pSVar38->super_IVariant).field_0xc != 0xf)))))) {
            bVar29 = Compiler::is_builtin_variable((Compiler *)this,pSVar37);
            if ((bVar29) && (*(int *)&(pSVar38->super_IVariant).field_0xc == 0xf)) {
              local_124._4_4_ = Compiler::get_pointee_type_id((Compiler *)this,local_124._4_4_);
              pSVar38 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (uint)local_124._4_4_);
              sVar4 = (pSVar38->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              p_Var48 = local_e0;
              if (sVar4 != 0) {
                local_a0 = (TypedID<(spirv_cross::Types)6> *)
                           (pSVar38->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
                lVar47 = sVar4 << 2;
                uVar44 = 0;
                local_b8 = pSVar38;
                local_98 = pSVar37;
                do {
                  local_110._0_4_ = 0x7fffffff;
                  bVar29 = Compiler::is_member_builtin
                                     ((Compiler *)this,local_b8,(uint32_t)uVar44,
                                      (BuiltIn *)local_110);
                  if (bVar29) {
                    bVar29 = Compiler::has_active_builtin
                                       ((Compiler *)this,local_110._0_4_,pSVar37->storage);
                    if (bVar29) {
                      uVar30 = ParsedIR::increase_bound_by(local_c8,2);
                      pTVar41 = local_a0;
                      local_c0 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)CONCAT44(local_c0._4_4_,uVar30 + 1);
                      local_124._8_4_ = uVar30;
                      pSVar38 = Variant::get<spirv_cross::SPIRType>
                                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                           super_VectorView<spirv_cross::Variant>.ptr +
                                           local_a0[uVar44].id);
                      pSVar38 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                          ((Compiler *)this,uVar30,pSVar38);
                      pSVar27 = local_d8;
                      (pSVar38->super_IVariant).self.id = pTVar41[uVar44].id;
                      pSVar38->storage = pSVar37->storage;
                      pSVar38->pointer = true;
                      (pSVar38->parent_type).id = pTVar41[uVar44].id;
                      uVar30 = pTVar41[uVar44].id;
                      SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                                (local_d0,(local_d8->arguments).
                                          super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                                          buffer_size + 1);
                      pPVar6 = (pSVar27->arguments).
                               super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
                      sVar4 = (pSVar27->arguments).
                              super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
                      pPVar6[sVar4].type.id = uVar30;
                      pPVar6[sVar4].id.id = (uint32_t)local_c0;
                      pPVar6[sVar4].read_count = 0;
                      pPVar6[sVar4].write_count = 0;
                      pPVar6[sVar4].alias_global_variable = true;
                      (pSVar27->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                      buffer_size = sVar4 + 1;
                      local_118.id = 7;
                      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                                ((Compiler *)this,(uint32_t)local_c0,(uint *)(local_124 + 8),
                                 &local_118.id);
                      p_Var28 = local_b0;
                      local_118.id = local_124._4_4_;
                      pmVar39 = ::std::__detail::
                                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)local_b0,&local_118);
                      pDVar7 = (pmVar39->members).super_VectorView<spirv_cross::Meta::Decoration>.
                               ptr;
                      pmVar39 = (mapped_type *)(pDVar7 + (uVar44 & 0xffffffff));
                      local_8c.id = (uint32_t)local_c0;
                      pmVar40 = ::std::__detail::
                                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)p_Var28,&local_8c);
                      ::std::__cxx11::string::_M_assign((string *)pmVar40);
                      ::std::__cxx11::string::_M_assign
                                ((string *)&(pmVar40->decoration).qualified_alias);
                      ::std::__cxx11::string::_M_assign
                                ((string *)&(pmVar40->decoration).hlsl_semantic);
                      (pmVar40->decoration).decoration_flags.lower =
                           pDVar7[uVar44 & 0xffffffff].decoration_flags.lower;
                      if (pmVar39 == pmVar40) {
                        BVar1 = (pmVar39->decoration).builtin_type;
                        uVar22 = (pmVar39->decoration).location;
                        uVar23 = (pmVar39->decoration).component;
                        uVar24 = (pmVar39->decoration).set;
                        uVar18 = (pmVar39->decoration).binding;
                        uVar19 = (pmVar39->decoration).offset;
                        uVar20 = (pmVar39->decoration).xfb_buffer;
                        uVar21 = (pmVar39->decoration).xfb_stride;
                        uVar30 = (pmVar39->decoration).stream;
                        uVar15 = (pmVar39->decoration).array_stride;
                        uVar16 = (pmVar39->decoration).matrix_stride;
                        uVar17 = (pmVar39->decoration).input_attachment;
                        uVar8 = *(undefined8 *)((long)&(pmVar39->decoration).index + 1);
                        *(undefined8 *)((long)&(pmVar40->decoration).input_attachment + 1) =
                             *(undefined8 *)((long)&(pmVar39->decoration).input_attachment + 1);
                        *(undefined8 *)((long)&(pmVar40->decoration).index + 1) = uVar8;
                        (pmVar40->decoration).stream = uVar30;
                        (pmVar40->decoration).array_stride = uVar15;
                        (pmVar40->decoration).matrix_stride = uVar16;
                        (pmVar40->decoration).input_attachment = uVar17;
                        (pmVar40->decoration).binding = uVar18;
                        (pmVar40->decoration).offset = uVar19;
                        (pmVar40->decoration).xfb_buffer = uVar20;
                        (pmVar40->decoration).xfb_stride = uVar21;
                        (pmVar40->decoration).builtin_type = BVar1;
                        (pmVar40->decoration).location = uVar22;
                        (pmVar40->decoration).component = uVar23;
                        (pmVar40->decoration).set = uVar24;
                        (pmVar40->decoration).extended.flags.lower =
                             (pmVar39->decoration).extended.flags.lower;
                      }
                      else {
                        ::std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&(pmVar40->decoration).decoration_flags.higher,
                                   &(pmVar39->decoration).decoration_flags.higher._M_h);
                        BVar1 = (pmVar39->decoration).builtin_type;
                        uVar22 = (pmVar39->decoration).location;
                        uVar23 = (pmVar39->decoration).component;
                        uVar24 = (pmVar39->decoration).set;
                        uVar18 = (pmVar39->decoration).binding;
                        uVar19 = (pmVar39->decoration).offset;
                        uVar20 = (pmVar39->decoration).xfb_buffer;
                        uVar21 = (pmVar39->decoration).xfb_stride;
                        uVar30 = (pmVar39->decoration).stream;
                        uVar15 = (pmVar39->decoration).array_stride;
                        uVar16 = (pmVar39->decoration).matrix_stride;
                        uVar17 = (pmVar39->decoration).input_attachment;
                        uVar8 = *(undefined8 *)((long)&(pmVar39->decoration).index + 1);
                        *(undefined8 *)((long)&(pmVar40->decoration).input_attachment + 1) =
                             *(undefined8 *)((long)&(pmVar39->decoration).input_attachment + 1);
                        *(undefined8 *)((long)&(pmVar40->decoration).index + 1) = uVar8;
                        (pmVar40->decoration).stream = uVar30;
                        (pmVar40->decoration).array_stride = uVar15;
                        (pmVar40->decoration).matrix_stride = uVar16;
                        (pmVar40->decoration).input_attachment = uVar17;
                        (pmVar40->decoration).binding = uVar18;
                        (pmVar40->decoration).offset = uVar19;
                        (pmVar40->decoration).xfb_buffer = uVar20;
                        (pmVar40->decoration).xfb_stride = uVar21;
                        (pmVar40->decoration).builtin_type = BVar1;
                        (pmVar40->decoration).location = uVar22;
                        (pmVar40->decoration).component = uVar23;
                        (pmVar40->decoration).set = uVar24;
                        (pmVar40->decoration).extended.flags.lower =
                             (pmVar39->decoration).extended.flags.lower;
                        ::std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&(pmVar40->decoration).extended.flags.higher,
                                   &(pmVar39->decoration).extended.flags.higher._M_h);
                      }
                      uVar8 = *(undefined8 *)(pmVar39->decoration).extended.values;
                      uVar9 = *(undefined8 *)((pmVar39->decoration).extended.values + 2);
                      uVar10 = *(undefined8 *)((pmVar39->decoration).extended.values + 4);
                      uVar11 = *(undefined8 *)((pmVar39->decoration).extended.values + 6);
                      uVar12 = *(undefined8 *)((pmVar39->decoration).extended.values + 8);
                      uVar13 = *(undefined8 *)((pmVar39->decoration).extended.values + 10);
                      uVar14 = *(undefined8 *)((pmVar39->decoration).extended.values + 0xd);
                      *(undefined8 *)((pmVar40->decoration).extended.values + 0xb) =
                           *(undefined8 *)((pmVar39->decoration).extended.values + 0xb);
                      *(undefined8 *)((pmVar40->decoration).extended.values + 0xd) = uVar14;
                      *(undefined8 *)((pmVar40->decoration).extended.values + 8) = uVar12;
                      *(undefined8 *)((pmVar40->decoration).extended.values + 10) = uVar13;
                      *(undefined8 *)((pmVar40->decoration).extended.values + 4) = uVar10;
                      *(undefined8 *)((pmVar40->decoration).extended.values + 6) = uVar11;
                      *(undefined8 *)(pmVar40->decoration).extended.values = uVar8;
                      *(undefined8 *)((pmVar40->decoration).extended.values + 2) = uVar9;
                      this = local_a8;
                      pSVar37 = local_98;
                    }
                  }
                  uVar44 = uVar44 + 1;
                  lVar47 = lVar47 + -4;
                  p_Var48 = local_e0;
                } while (lVar47 != 0);
              }
            }
            else {
              uVar30 = ParsedIR::increase_bound_by(local_c8,1);
              pSVar27 = local_d8;
              uVar26 = local_124._4_4_;
              SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                        (local_d0,(local_d8->arguments).
                                  super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
                                  + 1);
              this = local_a8;
              pPVar6 = (pSVar27->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                       ptr;
              sVar4 = (pSVar27->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                      buffer_size;
              pPVar6[sVar4].type.id = uVar26;
              pPVar6[sVar4].id.id = uVar30;
              pPVar6[sVar4].read_count = 0;
              pPVar6[sVar4].write_count = 0;
              pPVar6[sVar4].alias_global_variable = true;
              (pSVar27->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
              buffer_size = sVar4 + 1;
              local_110._0_4_ = 7;
              local_124._8_4_ = 0;
              local_b8 = (SPIRType *)CONCAT44(local_b8._4_4_,uVar30);
              Compiler::
              set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                        ((Compiler *)local_a8,uVar30,(uint *)(local_124 + 4),
                         (StorageClass *)local_110,(int *)(local_124 + 8),(uint *)local_124);
              uVar26 = local_124._0_4_;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&local_50,this,(ulong)(uint)local_124._0_4_,1);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              this_00 = (CompilerMSL *)0x2d7bb3;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"v","");
              ensure_valid_name((string *)local_110,this_00,&local_50,&local_70);
              p_Var48 = local_e0;
              Compiler::set_name((Compiler *)this,(ID)uVar26,(string *)local_110);
              if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
                operator_delete((void *)local_110._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              p_Var28 = local_b0;
              local_110._0_4_ = local_124._0_4_;
              pmVar39 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_b0,(key_type *)local_110);
              local_124._8_4_ = (uint32_t)local_b8;
              pmVar40 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)p_Var28,(key_type *)(local_124 + 8));
              ::std::__cxx11::string::_M_assign((string *)pmVar40);
              ::std::__cxx11::string::_M_assign((string *)&(pmVar40->decoration).qualified_alias);
              ::std::__cxx11::string::_M_assign((string *)&(pmVar40->decoration).hlsl_semantic);
              (pmVar40->decoration).decoration_flags.lower =
                   (pmVar39->decoration).decoration_flags.lower;
              if (pmVar39 == pmVar40) {
                BVar1 = (pmVar39->decoration).builtin_type;
                uVar22 = (pmVar39->decoration).location;
                uVar23 = (pmVar39->decoration).component;
                uVar24 = (pmVar39->decoration).set;
                uVar18 = (pmVar39->decoration).binding;
                uVar19 = (pmVar39->decoration).offset;
                uVar20 = (pmVar39->decoration).xfb_buffer;
                uVar21 = (pmVar39->decoration).xfb_stride;
                uVar30 = (pmVar39->decoration).stream;
                uVar15 = (pmVar39->decoration).array_stride;
                uVar16 = (pmVar39->decoration).matrix_stride;
                uVar17 = (pmVar39->decoration).input_attachment;
                uVar8 = *(undefined8 *)((long)&(pmVar39->decoration).index + 1);
                *(undefined8 *)((long)&(pmVar40->decoration).input_attachment + 1) =
                     *(undefined8 *)((long)&(pmVar39->decoration).input_attachment + 1);
                *(undefined8 *)((long)&(pmVar40->decoration).index + 1) = uVar8;
                (pmVar40->decoration).stream = uVar30;
                (pmVar40->decoration).array_stride = uVar15;
                (pmVar40->decoration).matrix_stride = uVar16;
                (pmVar40->decoration).input_attachment = uVar17;
                (pmVar40->decoration).binding = uVar18;
                (pmVar40->decoration).offset = uVar19;
                (pmVar40->decoration).xfb_buffer = uVar20;
                (pmVar40->decoration).xfb_stride = uVar21;
                (pmVar40->decoration).builtin_type = BVar1;
                (pmVar40->decoration).location = uVar22;
                (pmVar40->decoration).component = uVar23;
                (pmVar40->decoration).set = uVar24;
                (pmVar40->decoration).extended.flags.lower =
                     (pmVar39->decoration).extended.flags.lower;
              }
              else {
                ::std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                          ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)&(pmVar40->decoration).decoration_flags.higher,
                           &(pmVar39->decoration).decoration_flags.higher._M_h);
                BVar1 = (pmVar39->decoration).builtin_type;
                uVar22 = (pmVar39->decoration).location;
                uVar23 = (pmVar39->decoration).component;
                uVar24 = (pmVar39->decoration).set;
                uVar18 = (pmVar39->decoration).binding;
                uVar19 = (pmVar39->decoration).offset;
                uVar20 = (pmVar39->decoration).xfb_buffer;
                uVar21 = (pmVar39->decoration).xfb_stride;
                uVar30 = (pmVar39->decoration).stream;
                uVar15 = (pmVar39->decoration).array_stride;
                uVar16 = (pmVar39->decoration).matrix_stride;
                uVar17 = (pmVar39->decoration).input_attachment;
                uVar8 = *(undefined8 *)((long)&(pmVar39->decoration).index + 1);
                *(undefined8 *)((long)&(pmVar40->decoration).input_attachment + 1) =
                     *(undefined8 *)((long)&(pmVar39->decoration).input_attachment + 1);
                *(undefined8 *)((long)&(pmVar40->decoration).index + 1) = uVar8;
                (pmVar40->decoration).stream = uVar30;
                (pmVar40->decoration).array_stride = uVar15;
                (pmVar40->decoration).matrix_stride = uVar16;
                (pmVar40->decoration).input_attachment = uVar17;
                (pmVar40->decoration).binding = uVar18;
                (pmVar40->decoration).offset = uVar19;
                (pmVar40->decoration).xfb_buffer = uVar20;
                (pmVar40->decoration).xfb_stride = uVar21;
                (pmVar40->decoration).builtin_type = BVar1;
                (pmVar40->decoration).location = uVar22;
                (pmVar40->decoration).component = uVar23;
                (pmVar40->decoration).set = uVar24;
                (pmVar40->decoration).extended.flags.lower =
                     (pmVar39->decoration).extended.flags.lower;
                ::std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                          ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)&(pmVar40->decoration).extended.flags.higher,
                           &(pmVar39->decoration).extended.flags.higher._M_h);
              }
              uVar8 = *(undefined8 *)(pmVar39->decoration).extended.values;
              uVar9 = *(undefined8 *)((pmVar39->decoration).extended.values + 2);
              uVar10 = *(undefined8 *)((pmVar39->decoration).extended.values + 4);
              uVar11 = *(undefined8 *)((pmVar39->decoration).extended.values + 6);
              uVar12 = *(undefined8 *)((pmVar39->decoration).extended.values + 8);
              uVar13 = *(undefined8 *)((pmVar39->decoration).extended.values + 10);
              uVar14 = *(undefined8 *)((pmVar39->decoration).extended.values + 0xd);
              *(undefined8 *)((pmVar40->decoration).extended.values + 0xb) =
                   *(undefined8 *)((pmVar39->decoration).extended.values + 0xb);
              *(undefined8 *)((pmVar40->decoration).extended.values + 0xd) = uVar14;
              *(undefined8 *)((pmVar40->decoration).extended.values + 8) = uVar12;
              *(undefined8 *)((pmVar40->decoration).extended.values + 10) = uVar13;
              *(undefined8 *)((pmVar40->decoration).extended.values + 4) = uVar10;
              *(undefined8 *)((pmVar40->decoration).extended.values + 6) = uVar11;
              *(undefined8 *)(pmVar40->decoration).extended.values = uVar8;
              *(undefined8 *)((pmVar40->decoration).extended.values + 2) = uVar9;
              SmallVector<spirv_cross::Meta::Decoration,_0UL>::operator=
                        (&pmVar40->members,&pmVar39->members);
              if (pmVar39 != pmVar40) {
                ::std::
                _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::
                _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                          ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)&pmVar40->decoration_word_offset,
                           &(pmVar39->decoration_word_offset)._M_h);
              }
              uVar25 = *(undefined3 *)&pmVar39->field_0x1b9;
              uVar30 = pmVar39->hlsl_magic_counter_buffer;
              pmVar40->hlsl_is_magic_counter_buffer = pmVar39->hlsl_is_magic_counter_buffer;
              *(undefined3 *)&pmVar40->field_0x1b9 = uVar25;
              pmVar40->hlsl_magic_counter_buffer = uVar30;
            }
          }
          else {
            local_110._0_8_ = local_110 + 0x10;
            local_110._8_8_ = 0;
            local_100._M_allocated_capacity = local_100._M_allocated_capacity & 0xffffffffffffff00;
            if (pSVar37->storage == StorageClassOutput) {
              if ((local_88 & 1) == 0) {
                ::std::__cxx11::string::_M_replace((ulong)local_110,0,(char *)0x0,0x2e46c7);
                local_124._0_4_ = (this->stage_out_ptr_var_id).id;
                local_88 = CONCAT71((uint7)(uint3)((uint)local_124._0_4_ >> 8),1);
                goto LAB_00258be0;
              }
            }
            else {
              if (pSVar37->storage == StorageClassInput) {
                if ((local_80 & 1) != 0) goto LAB_00258c92;
                ::std::__cxx11::string::_M_replace((ulong)local_110,0,(char *)0x0,0x2ed309);
                local_124._0_4_ = (this->stage_in_ptr_var_id).id;
                local_80 = CONCAT71((uint7)(uint3)((uint)local_124._0_4_ >> 8),1);
              }
LAB_00258be0:
              pSVar37 = Variant::get<spirv_cross::SPIRVariable>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (uint)local_124._0_4_);
              local_124._4_4_ = *(undefined4 *)&(pSVar37->super_IVariant).field_0xc;
              id.id = ParsedIR::increase_bound_by(local_c8,1);
              pSVar27 = local_d8;
              uVar26 = local_124._4_4_;
              SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
                        (local_d0,(local_d8->arguments).
                                  super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size
                                  + 1);
              this = local_a8;
              pPVar6 = (pSVar27->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                       ptr;
              sVar4 = (pSVar27->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                      buffer_size;
              pPVar6[sVar4].type.id = uVar26;
              pPVar6[sVar4].id.id = id.id;
              pPVar6[sVar4].read_count = 0;
              pPVar6[sVar4].write_count = 0;
              pPVar6[sVar4].alias_global_variable = true;
              (pSVar27->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
              buffer_size = sVar4 + 1;
              local_124._8_4_ = 7;
              local_118.id = 0;
              Compiler::
              set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int,unsigned_int&>
                        ((Compiler *)local_a8,id.id,(uint *)(local_124 + 4),
                         (StorageClass *)(local_124 + 8),(int *)&local_118,(uint *)local_124);
              Compiler::set_name((Compiler *)this,id,(string *)local_110);
            }
LAB_00258c92:
            if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_110._0_8_ !=
                (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)(local_110 + 0x10)) {
              operator_delete((void *)local_110._0_8_);
            }
          }
          local_78 = (_Base_ptr)::std::_Rb_tree_increment(local_78);
        } while (local_78 != p_Var48);
      }
    }
  }
  else {
    p_Var32 = &::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->function_global_vars,&local_114)->_M_t;
    ::std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(&added_arg_ids->_M_t,p_Var32);
  }
  return;
LAB_00258370:
  p_Var36 = (__node_base_ptr)0x0;
LAB_00258372:
  if ((p_Var36 != (__node_base_ptr)0x0) && (p_Var36->_M_nxt != (_Hash_node_base *)0x0)) {
    __v = (ParsedIR *)local_110;
LAB_00258385:
    ::std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)added_arg_ids,(uint *)__v);
  }
switchD_00257ea3_caseD_3a:
  instr = instr + 1;
  if (instr == pIVar49) goto LAB_00258397;
  goto LAB_00257e77;
}

Assistant:

void CompilerMSL::extract_global_variables_from_function(uint32_t func_id, std::set<uint32_t> &added_arg_ids,
                                                         unordered_set<uint32_t> &global_var_ids,
                                                         unordered_set<uint32_t> &processed_func_ids)
{
	// Avoid processing a function more than once
	if (processed_func_ids.find(func_id) != processed_func_ids.end())
	{
		// Return function global variables
		added_arg_ids = function_global_vars[func_id];
		return;
	}

	processed_func_ids.insert(func_id);

	auto &func = get<SPIRFunction>(func_id);

	// Recursively establish global args added to functions on which we depend.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			switch (op)
			{
			case OpLoad:
			case OpInBoundsAccessChain:
			case OpAccessChain:
			case OpPtrAccessChain:
			case OpArrayLength:
			{
				uint32_t base_id = ops[2];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				// Use Metal's native frame-buffer fetch API for subpass inputs.
				auto &type = get<SPIRType>(ops[0]);
				if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
				    (!msl_options.is_ios() || !msl_options.ios_use_framebuffer_fetch_subpasses))
				{
					// Implicitly reads gl_FragCoord.
					assert(builtin_frag_coord_id != 0);
					added_arg_ids.insert(builtin_frag_coord_id);
					if (msl_options.multiview)
					{
						// Implicitly reads gl_ViewIndex.
						assert(builtin_view_idx_id != 0);
						added_arg_ids.insert(builtin_view_idx_id);
					}
					else if (msl_options.arrayed_subpass_input)
					{
						// Implicitly reads gl_Layer.
						assert(builtin_layer_id != 0);
						added_arg_ids.insert(builtin_layer_id);
					}
				}

				break;
			}

			case OpFunctionCall:
			{
				// First see if any of the function call args are globals
				for (uint32_t arg_idx = 3; arg_idx < i.length; arg_idx++)
				{
					uint32_t arg_id = ops[arg_idx];
					if (global_var_ids.find(arg_id) != global_var_ids.end())
						added_arg_ids.insert(arg_id);
				}

				// Then recurse into the function itself to extract globals used internally in the function
				uint32_t inner_func_id = ops[2];
				std::set<uint32_t> inner_func_args;
				extract_global_variables_from_function(inner_func_id, inner_func_args, global_var_ids,
				                                       processed_func_ids);
				added_arg_ids.insert(inner_func_args.begin(), inner_func_args.end());
				break;
			}

			case OpStore:
			{
				uint32_t base_id = ops[0];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);

				uint32_t rvalue_id = ops[1];
				if (global_var_ids.find(rvalue_id) != global_var_ids.end())
					added_arg_ids.insert(rvalue_id);

				break;
			}

			case OpSelect:
			{
				uint32_t base_id = ops[3];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				base_id = ops[4];
				if (global_var_ids.find(base_id) != global_var_ids.end())
					added_arg_ids.insert(base_id);
				break;
			}

			// Emulate texture2D atomic operations
			case OpImageTexelPointer:
			{
				// When using the pointer, we need to know which variable it is actually loaded from.
				uint32_t base_id = ops[2];
				auto *var = maybe_get_backing_variable(base_id);
				if (var && atomic_image_vars.count(var->self))
				{
					if (global_var_ids.find(base_id) != global_var_ids.end())
						added_arg_ids.insert(base_id);
				}
				break;
			}

			default:
				break;
			}

			// TODO: Add all other operations which can affect memory.
			// We should consider a more unified system here to reduce boiler-plate.
			// This kind of analysis is done in several places ...
		}
	}

	function_global_vars[func_id] = added_arg_ids;

	// Add the global variables as arguments to the function
	if (func_id != ir.default_entry_point)
	{
		bool added_in = false;
		bool added_out = false;
		for (uint32_t arg_id : added_arg_ids)
		{
			auto &var = get<SPIRVariable>(arg_id);
			uint32_t type_id = var.basetype;
			auto *p_type = &get<SPIRType>(type_id);
			BuiltIn bi_type = BuiltIn(get_decoration(arg_id, DecorationBuiltIn));

			if (((is_tessellation_shader() && var.storage == StorageClassInput) ||
			     (get_execution_model() == ExecutionModelTessellationControl && var.storage == StorageClassOutput)) &&
			    !(has_decoration(arg_id, DecorationPatch) || is_patch_block(*p_type)) &&
			    (!is_builtin_variable(var) || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
			     bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
			     p_type->basetype == SPIRType::Struct))
			{
				// Tessellation control shaders see inputs and per-vertex outputs as arrays.
				// Similarly, tessellation evaluation shaders see per-vertex inputs as arrays.
				// We collected them into a structure; we must pass the array of this
				// structure to the function.
				std::string name;
				if (var.storage == StorageClassInput)
				{
					if (added_in)
						continue;
					name = "gl_in";
					arg_id = stage_in_ptr_var_id;
					added_in = true;
				}
				else if (var.storage == StorageClassOutput)
				{
					if (added_out)
						continue;
					name = "gl_out";
					arg_id = stage_out_ptr_var_id;
					added_out = true;
				}
				type_id = get<SPIRVariable>(arg_id).basetype;
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				set_name(next_id, name);
			}
			else if (is_builtin_variable(var) && p_type->basetype == SPIRType::Struct)
			{
				// Get the pointee type
				type_id = get_pointee_type_id(type_id);
				p_type = &get<SPIRType>(type_id);

				uint32_t mbr_idx = 0;
				for (auto &mbr_type_id : p_type->member_types)
				{
					BuiltIn builtin = BuiltInMax;
					bool is_builtin = is_member_builtin(*p_type, mbr_idx, &builtin);
					if (is_builtin && has_active_builtin(builtin, var.storage))
					{
						// Add a arg variable with the same type and decorations as the member
						uint32_t next_ids = ir.increase_bound_by(2);
						uint32_t ptr_type_id = next_ids + 0;
						uint32_t var_id = next_ids + 1;

						// Make sure we have an actual pointer type,
						// so that we will get the appropriate address space when declaring these builtins.
						auto &ptr = set<SPIRType>(ptr_type_id, get<SPIRType>(mbr_type_id));
						ptr.self = mbr_type_id;
						ptr.storage = var.storage;
						ptr.pointer = true;
						ptr.parent_type = mbr_type_id;

						func.add_parameter(mbr_type_id, var_id, true);
						set<SPIRVariable>(var_id, ptr_type_id, StorageClassFunction);
						ir.meta[var_id].decoration = ir.meta[type_id].members[mbr_idx];
					}
					mbr_idx++;
				}
			}
			else
			{
				uint32_t next_id = ir.increase_bound_by(1);
				func.add_parameter(type_id, next_id, true);
				set<SPIRVariable>(next_id, type_id, StorageClassFunction, 0, arg_id);

				// Ensure the existing variable has a valid name and the new variable has all the same meta info
				set_name(arg_id, ensure_valid_name(to_name(arg_id), "v"));
				ir.meta[next_id] = ir.meta[arg_id];
			}
		}
	}
}